

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::CanonIterData::addToStartSet
          (CanonIterData *this,UChar32 origin,UChar32 decompLead,UErrorCode *errorCode)

{
  uint32_t uVar1;
  uint uVar2;
  UnicodeSet *this_00;
  size_t size;
  UnicodeSet *local_60;
  UChar32 firstOrigin;
  UnicodeSet *local_30;
  UnicodeSet *set;
  uint32_t canonValue;
  UErrorCode *errorCode_local;
  UChar32 decompLead_local;
  UChar32 origin_local;
  CanonIterData *this_local;
  
  size = (size_t)(uint)decompLead;
  uVar1 = umutablecptrie_get_63(this->mutableTrie,decompLead);
  if (((uVar1 & 0x3fffff) == 0) && (origin != 0)) {
    umutablecptrie_set_63(this->mutableTrie,decompLead,uVar1 | origin,errorCode);
  }
  else {
    if ((uVar1 & 0x200000) == 0) {
      this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,size);
      local_60 = (UnicodeSet *)0x0;
      if (this_00 != (UnicodeSet *)0x0) {
        UnicodeSet::UnicodeSet(this_00);
        local_60 = this_00;
      }
      local_30 = local_60;
      if (local_60 == (UnicodeSet *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      uVar2 = UVector::size(&this->canonStartSets);
      umutablecptrie_set_63
                (this->mutableTrie,decompLead,uVar1 & 0xffe00000 | 0x200000 | uVar2,errorCode);
      UVector::addElement(&this->canonStartSets,local_60,errorCode);
      if ((uVar1 & 0x1fffff) != 0) {
        UnicodeSet::add(local_60,uVar1 & 0x1fffff);
      }
    }
    else {
      local_30 = (UnicodeSet *)UVector::operator[](&this->canonStartSets,uVar1 & 0x1fffff);
    }
    UnicodeSet::add(local_30,origin);
  }
  return;
}

Assistant:

void CanonIterData::addToStartSet(UChar32 origin, UChar32 decompLead, UErrorCode &errorCode) {
    uint32_t canonValue = umutablecptrie_get(mutableTrie, decompLead);
    if((canonValue&(CANON_HAS_SET|CANON_VALUE_MASK))==0 && origin!=0) {
        // origin is the first character whose decomposition starts with
        // the character for which we are setting the value.
        umutablecptrie_set(mutableTrie, decompLead, canonValue|origin, &errorCode);
    } else {
        // origin is not the first character, or it is U+0000.
        UnicodeSet *set;
        if((canonValue&CANON_HAS_SET)==0) {
            set=new UnicodeSet;
            if(set==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            UChar32 firstOrigin=(UChar32)(canonValue&CANON_VALUE_MASK);
            canonValue=(canonValue&~CANON_VALUE_MASK)|CANON_HAS_SET|(uint32_t)canonStartSets.size();
            umutablecptrie_set(mutableTrie, decompLead, canonValue, &errorCode);
            canonStartSets.addElement(set, errorCode);
            if(firstOrigin!=0) {
                set->add(firstOrigin);
            }
        } else {
            set=(UnicodeSet *)canonStartSets[(int32_t)(canonValue&CANON_VALUE_MASK)];
        }
        set->add(origin);
    }
}